

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaCorot_20.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementHexaCorot_20::ComputeJacobian
          (ChElementHexaCorot_20 *this,ChMatrixDynamic<> *Jacobian,ChMatrixDynamic<> *J1,
          ChVector<double> *coord)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  long lVar16;
  long lVar17;
  double *pdVar18;
  ActualDstType actualDst;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  ChMatrixDynamic<> J2;
  DenseStorage<double,__1,__1,__1,_1> local_78;
  Matrix<double,__1,__1,_0,__1,__1> local_58;
  assign_op<double,_double> local_39;
  Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0>
  local_38;
  
  local_78.m_data = (double *)0x0;
  local_78.m_rows = 0;
  local_78.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_78,0x3c,0x14,3);
  lVar16 = (J1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_rows;
  if ((0 < lVar16) &&
     (lVar17 = (J1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
               m_cols, 0 < lVar17)) {
    auVar20._8_8_ = 0;
    auVar20._0_8_ = coord->m_data[0];
    pdVar18 = (J1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
              m_data;
    auVar19 = ZEXT816(0x3ff0000000000000);
    auVar29 = ZEXT816(0xc000000000000000);
    auVar20 = vfmadd213sd_fma(auVar20,auVar29,ZEXT816(0xbff0000000000000));
    *pdVar18 = (1.0 - coord->m_data[2]) * (1.0 - coord->m_data[1]) *
               ((auVar20._0_8_ - coord->m_data[1]) - coord->m_data[2]) * -0.125;
    if (lVar17 != 1) {
      auVar42._8_8_ = 0;
      auVar42._0_8_ = coord->m_data[0];
      auVar21 = ZEXT816(0x4000000000000000);
      auVar20 = vfmadd213sd_fma(auVar42,auVar21,ZEXT816(0xbff0000000000000));
      pdVar18[1] = (1.0 - coord->m_data[2]) * (1.0 - coord->m_data[1]) *
                   ((auVar20._0_8_ - coord->m_data[1]) - coord->m_data[2]) * 0.125;
      if (2 < lVar17) {
        auVar43._8_8_ = 0;
        auVar43._0_8_ = coord->m_data[0];
        auVar20 = vfmadd213sd_fma(auVar43,auVar21,ZEXT816(0xbff0000000000000));
        pdVar18[2] = (1.0 - coord->m_data[2]) * (coord->m_data[1] + 1.0) *
                     ((auVar20._0_8_ + coord->m_data[1]) - coord->m_data[2]) * 0.125;
        if (lVar17 != 3) {
          auVar44._8_8_ = 0;
          auVar44._0_8_ = coord->m_data[0];
          auVar20 = vfmadd213sd_fma(auVar44,auVar29,ZEXT816(0xbff0000000000000));
          pdVar18[3] = (1.0 - coord->m_data[2]) * (coord->m_data[1] + 1.0) *
                       ((auVar20._0_8_ + coord->m_data[1]) - coord->m_data[2]) * -0.125;
          if (4 < lVar17) {
            auVar45._8_8_ = 0;
            auVar45._0_8_ = coord->m_data[0];
            auVar20 = vfmadd213sd_fma(auVar45,auVar29,ZEXT816(0xbff0000000000000));
            pdVar18[4] = (coord->m_data[2] + 1.0) * (1.0 - coord->m_data[1]) *
                         (coord->m_data[2] + (auVar20._0_8_ - coord->m_data[1])) * -0.125;
            if (lVar17 != 5) {
              auVar46._8_8_ = 0;
              auVar46._0_8_ = coord->m_data[0];
              auVar20 = vfmadd213sd_fma(auVar46,auVar21,ZEXT816(0xbff0000000000000));
              pdVar18[5] = (coord->m_data[2] + 1.0) * (1.0 - coord->m_data[1]) *
                           (coord->m_data[2] + (auVar20._0_8_ - coord->m_data[1])) * 0.125;
              if (6 < lVar17) {
                auVar47._8_8_ = 0;
                auVar47._0_8_ = coord->m_data[0];
                auVar20 = vfmadd213sd_fma(auVar47,auVar21,ZEXT816(0xbff0000000000000));
                pdVar18[6] = (coord->m_data[2] + 1.0) * (coord->m_data[1] + 1.0) *
                             (coord->m_data[2] + auVar20._0_8_ + coord->m_data[1]) * 0.125;
                if (lVar17 != 7) {
                  auVar48._8_8_ = 0;
                  auVar48._0_8_ = coord->m_data[0];
                  auVar20 = vfmadd213sd_fma(auVar48,auVar29,ZEXT816(0xbff0000000000000));
                  pdVar18[7] = (coord->m_data[2] + 1.0) * (coord->m_data[1] + 1.0) *
                               (coord->m_data[2] + auVar20._0_8_ + coord->m_data[1]) * -0.125;
                  if ((8 < lVar17) &&
                     (pdVar18[8] = (1.0 - coord->m_data[2]) *
                                   (1.0 - coord->m_data[1]) * coord->m_data[0] * -0.5, lVar17 != 9))
                  {
                    auVar34._8_8_ = 0;
                    auVar34._0_8_ = coord->m_data[1];
                    auVar20 = vfnmadd213sd_fma(auVar34,auVar34,auVar19);
                    pdVar18[9] = (1.0 - coord->m_data[2]) * auVar20._0_8_ * 0.25;
                    if ((10 < lVar17) &&
                       (pdVar18[10] = (1.0 - coord->m_data[2]) *
                                      (coord->m_data[1] + 1.0) * coord->m_data[0] * -0.5,
                       lVar17 != 0xb)) {
                      auVar35._8_8_ = 0;
                      auVar35._0_8_ = coord->m_data[1];
                      auVar20 = vfnmadd213sd_fma(auVar35,auVar35,auVar19);
                      pdVar18[0xb] = (1.0 - coord->m_data[2]) * auVar20._0_8_ * -0.25;
                      if ((0xc < lVar17) &&
                         (pdVar18[0xc] = (coord->m_data[2] + 1.0) *
                                         (1.0 - coord->m_data[1]) * coord->m_data[0] * -0.5,
                         lVar17 != 0xd)) {
                        auVar36._8_8_ = 0;
                        auVar36._0_8_ = coord->m_data[1];
                        auVar20 = vfnmadd213sd_fma(auVar36,auVar36,auVar19);
                        pdVar18[0xd] = (coord->m_data[2] + 1.0) * auVar20._0_8_ * 0.25;
                        if ((0xe < lVar17) &&
                           (pdVar18[0xe] = (coord->m_data[2] + 1.0) *
                                           (coord->m_data[1] + 1.0) * coord->m_data[0] * -0.5,
                           lVar17 != 0xf)) {
                          auVar37._8_8_ = 0;
                          auVar37._0_8_ = coord->m_data[1];
                          auVar20 = vfnmadd213sd_fma(auVar37,auVar37,auVar19);
                          pdVar18[0xf] = (coord->m_data[2] + 1.0) * auVar20._0_8_ * -0.25;
                          if (0x10 < lVar17) {
                            auVar38._8_8_ = 0;
                            auVar38._0_8_ = coord->m_data[2];
                            auVar20 = vfnmadd213sd_fma(auVar38,auVar38,auVar19);
                            pdVar18[0x10] = auVar20._0_8_ * (1.0 - coord->m_data[1]) * 0.25;
                            if (lVar17 != 0x11) {
                              auVar39._8_8_ = 0;
                              auVar39._0_8_ = coord->m_data[2];
                              auVar20 = vfnmadd213sd_fma(auVar39,auVar39,auVar19);
                              pdVar18[0x11] = auVar20._0_8_ * (coord->m_data[1] + 1.0) * 0.25;
                              if (0x12 < lVar17) {
                                auVar40._8_8_ = 0;
                                auVar40._0_8_ = coord->m_data[2];
                                auVar20 = vfnmadd213sd_fma(auVar40,auVar40,auVar19);
                                pdVar18[0x12] = auVar20._0_8_ * (coord->m_data[1] + 1.0) * -0.25;
                                if (lVar17 != 0x13) {
                                  auVar41._8_8_ = 0;
                                  auVar41._0_8_ = coord->m_data[2];
                                  auVar20 = vfnmadd213sd_fma(auVar41,auVar41,auVar19);
                                  pdVar18[0x13] = auVar20._0_8_ * (1.0 - coord->m_data[1]) * -0.25;
                                  if (lVar16 != 1) {
                                    auVar1._8_8_ = 0;
                                    auVar1._0_8_ = coord->m_data[1];
                                    auVar49._8_8_ = 0;
                                    auVar49._0_8_ = -1.0 - coord->m_data[0];
                                    auVar20 = vfmadd231sd_fma(auVar49,auVar29,auVar1);
                                    pdVar18[lVar17] =
                                         (1.0 - coord->m_data[2]) * -(1.0 - coord->m_data[0]) *
                                         (auVar20._0_8_ - coord->m_data[2]) * 0.125;
                                    auVar2._8_8_ = 0;
                                    auVar2._0_8_ = coord->m_data[1];
                                    auVar50._8_8_ = 0;
                                    auVar50._0_8_ = coord->m_data[0] + -1.0;
                                    auVar20 = vfmadd231sd_fma(auVar50,auVar29,auVar2);
                                    pdVar18[lVar17 + 1] =
                                         (1.0 - coord->m_data[2]) * -(coord->m_data[0] + 1.0) *
                                         (auVar20._0_8_ - coord->m_data[2]) * 0.125;
                                    auVar3._8_8_ = 0;
                                    auVar3._0_8_ = coord->m_data[1];
                                    auVar51._8_8_ = 0;
                                    auVar51._0_8_ = coord->m_data[0] + -1.0;
                                    auVar20 = vfmadd231sd_fma(auVar51,auVar21,auVar3);
                                    pdVar18[lVar17 + 2] =
                                         (coord->m_data[0] + 1.0) * (1.0 - coord->m_data[2]) *
                                         (auVar20._0_8_ - coord->m_data[2]) * 0.125;
                                    auVar4._8_8_ = 0;
                                    auVar4._0_8_ = coord->m_data[1];
                                    auVar52._8_8_ = 0;
                                    auVar52._0_8_ = -1.0 - coord->m_data[0];
                                    auVar20 = vfmadd231sd_fma(auVar52,auVar21,auVar4);
                                    pdVar18[lVar17 + 3] =
                                         (1.0 - coord->m_data[0]) * (1.0 - coord->m_data[2]) *
                                         (auVar20._0_8_ - coord->m_data[2]) * 0.125;
                                    auVar5._8_8_ = 0;
                                    auVar5._0_8_ = coord->m_data[1];
                                    auVar53._8_8_ = 0;
                                    auVar53._0_8_ = -1.0 - coord->m_data[0];
                                    auVar20 = vfmadd231sd_fma(auVar53,auVar29,auVar5);
                                    pdVar18[lVar17 + 4] =
                                         (coord->m_data[2] + 1.0) * -(1.0 - coord->m_data[0]) *
                                         (coord->m_data[2] + auVar20._0_8_) * 0.125;
                                    auVar6._8_8_ = 0;
                                    auVar6._0_8_ = coord->m_data[1];
                                    auVar54._8_8_ = 0;
                                    auVar54._0_8_ = coord->m_data[0] + -1.0;
                                    auVar20 = vfmadd231sd_fma(auVar54,auVar29,auVar6);
                                    pdVar18[lVar17 + 5] =
                                         (coord->m_data[2] + 1.0) * -(coord->m_data[0] + 1.0) *
                                         (coord->m_data[2] + auVar20._0_8_) * 0.125;
                                    auVar7._8_8_ = 0;
                                    auVar7._0_8_ = coord->m_data[1];
                                    auVar55._8_8_ = 0;
                                    auVar55._0_8_ = coord->m_data[0] + -1.0;
                                    auVar20 = vfmadd231sd_fma(auVar55,auVar21,auVar7);
                                    pdVar18[lVar17 + 6] =
                                         (coord->m_data[0] + 1.0) * (coord->m_data[2] + 1.0) *
                                         (coord->m_data[2] + auVar20._0_8_) * 0.125;
                                    auVar8._8_8_ = 0;
                                    auVar8._0_8_ = coord->m_data[1];
                                    auVar56._8_8_ = 0;
                                    auVar56._0_8_ = -1.0 - coord->m_data[0];
                                    auVar20 = vfmadd231sd_fma(auVar56,auVar21,auVar8);
                                    pdVar18[lVar17 + 7] =
                                         (1.0 - coord->m_data[0]) * (coord->m_data[2] + 1.0) *
                                         (coord->m_data[2] + auVar20._0_8_) * 0.125;
                                    auVar57._8_8_ = 0;
                                    auVar57._0_8_ = coord->m_data[0];
                                    auVar20 = vfnmadd213sd_fma(auVar57,auVar57,auVar19);
                                    pdVar18[lVar17 + 8] =
                                         (1.0 - coord->m_data[2]) * -auVar20._0_8_ * 0.25;
                                    pdVar18[lVar17 + 9] =
                                         (1.0 - coord->m_data[2]) *
                                         (coord->m_data[0] + 1.0) * coord->m_data[1] * -0.5;
                                    auVar58._8_8_ = 0;
                                    auVar58._0_8_ = coord->m_data[0];
                                    auVar20 = vfnmadd213sd_fma(auVar58,auVar58,auVar19);
                                    pdVar18[lVar17 + 10] =
                                         auVar20._0_8_ * (1.0 - coord->m_data[2]) * 0.25;
                                    pdVar18[lVar17 + 0xb] =
                                         (1.0 - coord->m_data[0]) * coord->m_data[1] *
                                         (1.0 - coord->m_data[2]) * -0.5;
                                    auVar59._8_8_ = 0;
                                    auVar59._0_8_ = coord->m_data[0];
                                    auVar20 = vfnmadd213sd_fma(auVar59,auVar59,auVar19);
                                    pdVar18[lVar17 + 0xc] =
                                         (coord->m_data[2] + 1.0) * -auVar20._0_8_ * 0.25;
                                    pdVar18[lVar17 + 0xd] =
                                         (coord->m_data[0] + 1.0) * coord->m_data[1] *
                                         (coord->m_data[2] + 1.0) * -0.5;
                                    auVar60._8_8_ = 0;
                                    auVar60._0_8_ = coord->m_data[0];
                                    auVar20 = vfnmadd213sd_fma(auVar60,auVar60,auVar19);
                                    pdVar18[lVar17 + 0xe] =
                                         auVar20._0_8_ * (coord->m_data[2] + 1.0) * 0.25;
                                    pdVar18[lVar17 + 0xf] =
                                         (1.0 - coord->m_data[0]) * coord->m_data[1] *
                                         (coord->m_data[2] + 1.0) * -0.5;
                                    auVar61._8_8_ = 0;
                                    auVar61._0_8_ = coord->m_data[2];
                                    auVar20 = vfnmadd213sd_fma(auVar61,auVar61,auVar19);
                                    pdVar18[lVar17 + 0x10] =
                                         auVar20._0_8_ * -(coord->m_data[0] + 1.0) * 0.25;
                                    auVar62._8_8_ = 0;
                                    auVar62._0_8_ = coord->m_data[2];
                                    auVar20 = vfnmadd213sd_fma(auVar62,auVar62,auVar19);
                                    pdVar18[lVar17 + 0x11] =
                                         (coord->m_data[0] + 1.0) * auVar20._0_8_ * 0.25;
                                    auVar63._8_8_ = 0;
                                    auVar63._0_8_ = coord->m_data[2];
                                    auVar20 = vfnmadd213sd_fma(auVar63,auVar63,auVar19);
                                    pdVar18[lVar17 + 0x12] =
                                         (1.0 - coord->m_data[0]) * auVar20._0_8_ * 0.25;
                                    auVar64._8_8_ = 0;
                                    auVar64._0_8_ = coord->m_data[2];
                                    auVar20 = vfnmadd213sd_fma(auVar64,auVar64,auVar19);
                                    pdVar18[lVar17 + 0x13] =
                                         auVar20._0_8_ * -(1.0 - coord->m_data[0]) * 0.25;
                                    if (2 < lVar16) {
                                      auVar9._8_8_ = 0;
                                      auVar9._0_8_ = coord->m_data[2];
                                      auVar65._8_8_ = 0;
                                      auVar65._0_8_ = (-1.0 - coord->m_data[0]) - coord->m_data[1];
                                      auVar20 = vfmadd231sd_fma(auVar65,auVar29,auVar9);
                                      pdVar18[lVar17 * 2] =
                                           (1.0 - coord->m_data[1]) * -(1.0 - coord->m_data[0]) *
                                           auVar20._0_8_ * 0.125;
                                      auVar10._8_8_ = 0;
                                      auVar10._0_8_ = coord->m_data[2];
                                      auVar66._8_8_ = 0;
                                      auVar66._0_8_ = (coord->m_data[0] + -1.0) - coord->m_data[1];
                                      auVar20 = vfmadd231sd_fma(auVar66,auVar29,auVar10);
                                      pdVar18[lVar17 * 2 + 1] =
                                           (1.0 - coord->m_data[1]) * -(coord->m_data[0] + 1.0) *
                                           auVar20._0_8_ * 0.125;
                                      auVar11._8_8_ = 0;
                                      auVar11._0_8_ = coord->m_data[2];
                                      auVar67._8_8_ = 0;
                                      auVar67._0_8_ = coord->m_data[0] + -1.0 + coord->m_data[1];
                                      auVar20 = vfmadd231sd_fma(auVar67,auVar29,auVar11);
                                      pdVar18[lVar17 * 2 + 2] =
                                           (coord->m_data[1] + 1.0) * -(coord->m_data[0] + 1.0) *
                                           auVar20._0_8_ * 0.125;
                                      auVar12._8_8_ = 0;
                                      auVar12._0_8_ = coord->m_data[2];
                                      auVar68._8_8_ = 0;
                                      auVar68._0_8_ = (-1.0 - coord->m_data[0]) + coord->m_data[1];
                                      auVar20 = vfmadd231sd_fma(auVar68,auVar29,auVar12);
                                      pdVar18[lVar17 * 2 + 3] =
                                           (coord->m_data[1] + 1.0) * -(1.0 - coord->m_data[0]) *
                                           auVar20._0_8_ * 0.125;
                                      auVar29._8_8_ = 0;
                                      auVar29._0_8_ = coord->m_data[2];
                                      auVar30._8_8_ = 0;
                                      auVar30._0_8_ = (-1.0 - coord->m_data[0]) - coord->m_data[1];
                                      auVar20 = vfmadd231sd_fma(auVar30,auVar21,auVar29);
                                      pdVar18[lVar17 * 2 + 4] =
                                           (1.0 - coord->m_data[0]) * (1.0 - coord->m_data[1]) *
                                           auVar20._0_8_ * 0.125;
                                      auVar13._8_8_ = 0;
                                      auVar13._0_8_ = coord->m_data[2];
                                      auVar31._8_8_ = 0;
                                      auVar31._0_8_ = (coord->m_data[0] + -1.0) - coord->m_data[1];
                                      auVar20 = vfmadd231sd_fma(auVar31,auVar21,auVar13);
                                      pdVar18[lVar17 * 2 + 5] =
                                           (coord->m_data[0] + 1.0) * (1.0 - coord->m_data[1]) *
                                           auVar20._0_8_ * 0.125;
                                      auVar14._8_8_ = 0;
                                      auVar14._0_8_ = coord->m_data[2];
                                      auVar32._8_8_ = 0;
                                      auVar32._0_8_ = coord->m_data[1] + coord->m_data[0] + -1.0;
                                      auVar20 = vfmadd231sd_fma(auVar32,auVar21,auVar14);
                                      pdVar18[lVar17 * 2 + 6] =
                                           (coord->m_data[0] + 1.0) * (coord->m_data[1] + 1.0) *
                                           auVar20._0_8_ * 0.125;
                                      auVar15._8_8_ = 0;
                                      auVar15._0_8_ = coord->m_data[2];
                                      auVar33._8_8_ = 0;
                                      auVar33._0_8_ = coord->m_data[1] + (-1.0 - coord->m_data[0]);
                                      auVar20 = vfmadd231sd_fma(auVar33,auVar21,auVar15);
                                      pdVar18[lVar17 * 2 + 7] =
                                           (1.0 - coord->m_data[0]) * (coord->m_data[1] + 1.0) *
                                           auVar20._0_8_ * 0.125;
                                      auVar21._8_8_ = 0;
                                      auVar21._0_8_ = coord->m_data[0];
                                      auVar20 = vfnmadd213sd_fma(auVar21,auVar21,auVar19);
                                      pdVar18[lVar17 * 2 + 8] =
                                           (1.0 - coord->m_data[1]) * -auVar20._0_8_ * 0.25;
                                      auVar22._8_8_ = 0;
                                      auVar22._0_8_ = coord->m_data[1];
                                      auVar20 = vfnmadd213sd_fma(auVar22,auVar22,auVar19);
                                      pdVar18[lVar17 * 2 + 9] =
                                           auVar20._0_8_ * -(coord->m_data[0] + 1.0) * 0.25;
                                      auVar23._8_8_ = 0;
                                      auVar23._0_8_ = coord->m_data[0];
                                      auVar20 = vfnmadd213sd_fma(auVar23,auVar23,auVar19);
                                      pdVar18[lVar17 * 2 + 10] =
                                           (coord->m_data[1] + 1.0) * -auVar20._0_8_ * 0.25;
                                      auVar24._8_8_ = 0;
                                      auVar24._0_8_ = coord->m_data[1];
                                      auVar20 = vfnmadd213sd_fma(auVar24,auVar24,auVar19);
                                      pdVar18[lVar17 * 2 + 0xb] =
                                           auVar20._0_8_ * -(1.0 - coord->m_data[0]) * 0.25;
                                      auVar25._8_8_ = 0;
                                      auVar25._0_8_ = coord->m_data[0];
                                      auVar20 = vfnmadd213sd_fma(auVar25,auVar25,auVar19);
                                      pdVar18[lVar17 * 2 + 0xc] =
                                           auVar20._0_8_ * (1.0 - coord->m_data[1]) * 0.25;
                                      auVar26._8_8_ = 0;
                                      auVar26._0_8_ = coord->m_data[1];
                                      auVar20 = vfnmadd213sd_fma(auVar26,auVar26,auVar19);
                                      pdVar18[lVar17 * 2 + 0xd] =
                                           (coord->m_data[0] + 1.0) * auVar20._0_8_ * 0.25;
                                      auVar27._8_8_ = 0;
                                      auVar27._0_8_ = coord->m_data[0];
                                      auVar20 = vfnmadd213sd_fma(auVar27,auVar27,auVar19);
                                      pdVar18[lVar17 * 2 + 0xe] =
                                           auVar20._0_8_ * (coord->m_data[1] + 1.0) * 0.25;
                                      auVar28._8_8_ = 0;
                                      auVar28._0_8_ = coord->m_data[1];
                                      auVar20 = vfnmadd213sd_fma(auVar28,auVar28,auVar19);
                                      pdVar18[lVar17 * 2 + 0xf] =
                                           (1.0 - coord->m_data[0]) * auVar20._0_8_ * 0.25;
                                      pdVar18[lVar17 * 2 + 0x10] =
                                           (coord->m_data[0] + 1.0) * coord->m_data[2] *
                                           (1.0 - coord->m_data[1]) * -0.5;
                                      pdVar18[lVar17 * 2 + 0x11] =
                                           (coord->m_data[0] + 1.0) * coord->m_data[2] *
                                           (coord->m_data[1] + 1.0) * -0.5;
                                      pdVar18[lVar17 * 2 + 0x12] =
                                           (1.0 - coord->m_data[0]) * coord->m_data[2] *
                                           (coord->m_data[1] + 1.0) * -0.5;
                                      pdVar18[lVar17 * 2 + 0x13] =
                                           (1.0 - coord->m_data[0]) * coord->m_data[2] *
                                           (1.0 - coord->m_data[1]) * -0.5;
                                      (**(code **)(*(long *)&((((this->nodes).
                                                                                                                                
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  )._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_58)
                                      ;
                                      if ((0 < local_78.m_rows) && (0 < local_78.m_cols)) {
                                        *local_78.m_data =
                                             (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_data;
                                        (**(code **)(*(long *)&((this->nodes).
                                                                                                                                
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[1].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                        if ((1 < local_78.m_rows) && (0 < local_78.m_cols)) {
                                          local_78.m_data[local_78.m_cols] =
                                               (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_data;
                                          (**(code **)(*(long *)&((this->nodes).
                                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[2].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                          if ((2 < local_78.m_rows) && (0 < local_78.m_cols)) {
                                            local_78.m_data[local_78.m_cols * 2] =
                                                 (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_data;
                                            (**(code **)(*(long *)&((this->nodes).
                                                                                                                                        
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[3].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                            if ((3 < local_78.m_rows) && (0 < local_78.m_cols)) {
                                              local_78.m_data[local_78.m_cols * 3] =
                                                   (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_data;
                                              (**(code **)(*(long *)&((this->nodes).
                                                                                                                                            
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[4].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                              if ((4 < local_78.m_rows) && (0 < local_78.m_cols)) {
                                                local_78.m_data[local_78.m_cols * 4] =
                                                     (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_data;
                                                (**(code **)(*(long *)&((this->nodes).
                                                                                                                                                
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[5].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                if ((5 < local_78.m_rows) && (0 < local_78.m_cols))
                                                {
                                                  local_78.m_data[local_78.m_cols * 5] =
                                                       (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_data;
                                                  (**(code **)(*(long *)&((this->nodes).
                                                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[6].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                  if ((6 < local_78.m_rows) && (0 < local_78.m_cols)
                                                     ) {
                                                    local_78.m_data[local_78.m_cols * 6] =
                                                         (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_data;
                                                  (**(code **)(*(long *)&((this->nodes).
                                                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[7].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                  if ((7 < local_78.m_rows) && (0 < local_78.m_cols)
                                                     ) {
                                                    local_78.m_data[local_78.m_cols * 7] =
                                                         (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_data;
                                                  (**(code **)(*(long *)&((this->nodes).
                                                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[8].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                  if ((8 < local_78.m_rows) && (0 < local_78.m_cols)
                                                     ) {
                                                    local_78.m_data[local_78.m_cols * 8] =
                                                         (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_data;
                                                  (**(code **)(*(long *)&((this->nodes).
                                                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[9].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                  if ((9 < local_78.m_rows) && (0 < local_78.m_cols)
                                                     ) {
                                                    local_78.m_data[local_78.m_cols * 9] =
                                                         (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_data;
                                                  (**(code **)(*(long *)&((this->nodes).
                                                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[10].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                  if ((10 < local_78.m_rows) &&
                                                     (0 < local_78.m_cols)) {
                                                    local_78.m_data[local_78.m_cols * 10] =
                                                         (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_data;
                                                  (**(code **)(*(long *)&((this->nodes).
                                                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[0xb].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                  if ((0xb < local_78.m_rows) &&
                                                     (0 < local_78.m_cols)) {
                                                    local_78.m_data[local_78.m_cols * 0xb] =
                                                         (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_data;
                                                  (**(code **)(*(long *)&((this->nodes).
                                                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[0xc].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                  if ((0xc < local_78.m_rows) &&
                                                     (0 < local_78.m_cols)) {
                                                    local_78.m_data[local_78.m_cols * 0xc] =
                                                         (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_data;
                                                  (**(code **)(*(long *)&((this->nodes).
                                                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[0xd].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                  if ((0xd < local_78.m_rows) &&
                                                     (0 < local_78.m_cols)) {
                                                    local_78.m_data[local_78.m_cols * 0xd] =
                                                         (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_data;
                                                  (**(code **)(*(long *)&((this->nodes).
                                                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[0xe].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                  if ((0xe < local_78.m_rows) &&
                                                     (0 < local_78.m_cols)) {
                                                    local_78.m_data[local_78.m_cols * 0xe] =
                                                         (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_data;
                                                  (**(code **)(*(long *)&((this->nodes).
                                                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[0xf].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                  if ((0xf < local_78.m_rows) &&
                                                     (0 < local_78.m_cols)) {
                                                    local_78.m_data[local_78.m_cols * 0xf] =
                                                         (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_data;
                                                  (**(code **)(*(long *)&((this->nodes).
                                                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[0x10].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                  if ((0x10 < local_78.m_rows) &&
                                                     (0 < local_78.m_cols)) {
                                                    local_78.m_data[local_78.m_cols * 0x10] =
                                                         (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_data;
                                                  (**(code **)(*(long *)&((this->nodes).
                                                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[0x11].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                  if ((0x11 < local_78.m_rows) &&
                                                     (0 < local_78.m_cols)) {
                                                    local_78.m_data[local_78.m_cols * 0x11] =
                                                         (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_data;
                                                  (**(code **)(*(long *)&((this->nodes).
                                                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[0x12].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                  if ((0x12 < local_78.m_rows) &&
                                                     (0 < local_78.m_cols)) {
                                                    local_78.m_data[local_78.m_cols * 0x12] =
                                                         (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_data;
                                                  (**(code **)(*(long *)&((this->nodes).
                                                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[0x13].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                  if ((0x13 < local_78.m_rows) &&
                                                     (0 < local_78.m_cols)) {
                                                    local_78.m_data[local_78.m_cols * 0x13] =
                                                         (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_data;
                                                  (**(code **)(*(long *)&((((this->nodes).
                                                                                                                                                        
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  )._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                  if ((0 < local_78.m_rows) && (1 < local_78.m_cols)
                                                     ) {
                                                    local_78.m_data[1] =
                                                         (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_rows;
                                                  (**(code **)(*(long *)&((this->nodes).
                                                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[1].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                  if ((1 < local_78.m_rows) && (1 < local_78.m_cols)
                                                     ) {
                                                    local_78.m_data[local_78.m_cols + 1] =
                                                         (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_rows;
                                                  (**(code **)(*(long *)&((this->nodes).
                                                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[2].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                  if ((2 < local_78.m_rows) && (1 < local_78.m_cols)
                                                     ) {
                                                    local_78.m_data[local_78.m_cols * 2 + 1] =
                                                         (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_rows;
                                                  (**(code **)(*(long *)&((this->nodes).
                                                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[3].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                  if ((3 < local_78.m_rows) && (1 < local_78.m_cols)
                                                     ) {
                                                    local_78.m_data[local_78.m_cols * 3 + 1] =
                                                         (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_rows;
                                                  (**(code **)(*(long *)&((this->nodes).
                                                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[4].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                  if ((4 < local_78.m_rows) && (1 < local_78.m_cols)
                                                     ) {
                                                    local_78.m_data[local_78.m_cols * 4 + 1] =
                                                         (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_rows;
                                                  (**(code **)(*(long *)&((this->nodes).
                                                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[5].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                  if ((5 < local_78.m_rows) && (1 < local_78.m_cols)
                                                     ) {
                                                    local_78.m_data[local_78.m_cols * 5 + 1] =
                                                         (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_rows;
                                                  (**(code **)(*(long *)&((this->nodes).
                                                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[6].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                  if ((6 < local_78.m_rows) && (1 < local_78.m_cols)
                                                     ) {
                                                    local_78.m_data[local_78.m_cols * 6 + 1] =
                                                         (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_rows;
                                                  (**(code **)(*(long *)&((this->nodes).
                                                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[7].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                  if ((7 < local_78.m_rows) && (1 < local_78.m_cols)
                                                     ) {
                                                    local_78.m_data[local_78.m_cols * 7 + 1] =
                                                         (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_rows;
                                                  (**(code **)(*(long *)&((this->nodes).
                                                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[8].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                  if ((8 < local_78.m_rows) && (1 < local_78.m_cols)
                                                     ) {
                                                    local_78.m_data[local_78.m_cols * 8 + 1] =
                                                         (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_rows;
                                                  (**(code **)(*(long *)&((this->nodes).
                                                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[9].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                  if ((9 < local_78.m_rows) && (1 < local_78.m_cols)
                                                     ) {
                                                    local_78.m_data[local_78.m_cols * 9 + 1] =
                                                         (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_rows;
                                                  (**(code **)(*(long *)&((this->nodes).
                                                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[10].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                  if ((10 < local_78.m_rows) &&
                                                     (1 < local_78.m_cols)) {
                                                    local_78.m_data[local_78.m_cols * 10 + 1] =
                                                         (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_rows;
                                                  (**(code **)(*(long *)&((this->nodes).
                                                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[0xb].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                  if ((0xb < local_78.m_rows) &&
                                                     (1 < local_78.m_cols)) {
                                                    local_78.m_data[local_78.m_cols * 0xb + 1] =
                                                         (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_rows;
                                                  (**(code **)(*(long *)&((this->nodes).
                                                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[0xc].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                  if ((0xc < local_78.m_rows) &&
                                                     (1 < local_78.m_cols)) {
                                                    local_78.m_data[local_78.m_cols * 0xc + 1] =
                                                         (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_rows;
                                                  (**(code **)(*(long *)&((this->nodes).
                                                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[0xd].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                  if ((0xd < local_78.m_rows) &&
                                                     (1 < local_78.m_cols)) {
                                                    local_78.m_data[local_78.m_cols * 0xd + 1] =
                                                         (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_rows;
                                                  (**(code **)(*(long *)&((this->nodes).
                                                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[0xe].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                  if ((0xe < local_78.m_rows) &&
                                                     (1 < local_78.m_cols)) {
                                                    local_78.m_data[local_78.m_cols * 0xe + 1] =
                                                         (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_rows;
                                                  (**(code **)(*(long *)&((this->nodes).
                                                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[0xf].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                  if ((0xf < local_78.m_rows) &&
                                                     (1 < local_78.m_cols)) {
                                                    local_78.m_data[local_78.m_cols * 0xf + 1] =
                                                         (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_rows;
                                                  (**(code **)(*(long *)&((this->nodes).
                                                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[0x10].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                  if ((0x10 < local_78.m_rows) &&
                                                     (1 < local_78.m_cols)) {
                                                    local_78.m_data[local_78.m_cols * 0x10 + 1] =
                                                         (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_rows;
                                                  (**(code **)(*(long *)&((this->nodes).
                                                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[0x11].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                  if ((0x11 < local_78.m_rows) &&
                                                     (1 < local_78.m_cols)) {
                                                    local_78.m_data[local_78.m_cols * 0x11 + 1] =
                                                         (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_rows;
                                                  (**(code **)(*(long *)&((this->nodes).
                                                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[0x12].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                  if ((0x12 < local_78.m_rows) &&
                                                     (1 < local_78.m_cols)) {
                                                    local_78.m_data[local_78.m_cols * 0x12 + 1] =
                                                         (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_rows;
                                                  (**(code **)(*(long *)&((this->nodes).
                                                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[0x13].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                  if ((0x13 < local_78.m_rows) &&
                                                     (1 < local_78.m_cols)) {
                                                    local_78.m_data[local_78.m_cols * 0x13 + 1] =
                                                         (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_rows;
                                                  (**(code **)(*(long *)&((((this->nodes).
                                                                                                                                                        
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  )._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                  if ((0 < local_78.m_rows) && (2 < local_78.m_cols)
                                                     ) {
                                                    local_78.m_data[2] =
                                                         (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_cols;
                                                  (**(code **)(*(long *)&((this->nodes).
                                                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[1].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                  if ((1 < local_78.m_rows) && (2 < local_78.m_cols)
                                                     ) {
                                                    local_78.m_data[local_78.m_cols + 2] =
                                                         (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_cols;
                                                  (**(code **)(*(long *)&((this->nodes).
                                                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[2].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                  if ((2 < local_78.m_rows) && (2 < local_78.m_cols)
                                                     ) {
                                                    local_78.m_data[local_78.m_cols * 2 + 2] =
                                                         (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_cols;
                                                  (**(code **)(*(long *)&((this->nodes).
                                                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[3].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                  if ((3 < local_78.m_rows) && (2 < local_78.m_cols)
                                                     ) {
                                                    local_78.m_data[local_78.m_cols * 3 + 2] =
                                                         (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_cols;
                                                  (**(code **)(*(long *)&((this->nodes).
                                                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[4].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                  if ((4 < local_78.m_rows) && (2 < local_78.m_cols)
                                                     ) {
                                                    local_78.m_data[local_78.m_cols * 4 + 2] =
                                                         (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_cols;
                                                  (**(code **)(*(long *)&((this->nodes).
                                                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[5].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                  if ((5 < local_78.m_rows) && (2 < local_78.m_cols)
                                                     ) {
                                                    local_78.m_data[local_78.m_cols * 5 + 2] =
                                                         (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_cols;
                                                  (**(code **)(*(long *)&((this->nodes).
                                                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[6].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                  if ((6 < local_78.m_rows) && (2 < local_78.m_cols)
                                                     ) {
                                                    local_78.m_data[local_78.m_cols * 6 + 2] =
                                                         (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_cols;
                                                  (**(code **)(*(long *)&((this->nodes).
                                                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[7].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                  if ((7 < local_78.m_rows) && (2 < local_78.m_cols)
                                                     ) {
                                                    local_78.m_data[local_78.m_cols * 7 + 2] =
                                                         (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_cols;
                                                  (**(code **)(*(long *)&((this->nodes).
                                                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[8].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                  if ((8 < local_78.m_rows) && (2 < local_78.m_cols)
                                                     ) {
                                                    local_78.m_data[local_78.m_cols * 8 + 2] =
                                                         (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_cols;
                                                  (**(code **)(*(long *)&((this->nodes).
                                                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[9].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                  if ((9 < local_78.m_rows) && (2 < local_78.m_cols)
                                                     ) {
                                                    local_78.m_data[local_78.m_cols * 9 + 2] =
                                                         (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_cols;
                                                  (**(code **)(*(long *)&((this->nodes).
                                                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[10].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                  if ((10 < local_78.m_rows) &&
                                                     (2 < local_78.m_cols)) {
                                                    local_78.m_data[local_78.m_cols * 10 + 2] =
                                                         (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_cols;
                                                  (**(code **)(*(long *)&((this->nodes).
                                                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[0xb].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                  if ((0xb < local_78.m_rows) &&
                                                     (2 < local_78.m_cols)) {
                                                    local_78.m_data[local_78.m_cols * 0xb + 2] =
                                                         (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_cols;
                                                  (**(code **)(*(long *)&((this->nodes).
                                                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[0xc].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                  if ((0xc < local_78.m_rows) &&
                                                     (2 < local_78.m_cols)) {
                                                    local_78.m_data[local_78.m_cols * 0xc + 2] =
                                                         (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_cols;
                                                  (**(code **)(*(long *)&((this->nodes).
                                                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[0xd].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                  if ((0xd < local_78.m_rows) &&
                                                     (2 < local_78.m_cols)) {
                                                    local_78.m_data[local_78.m_cols * 0xd + 2] =
                                                         (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_cols;
                                                  (**(code **)(*(long *)&((this->nodes).
                                                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[0xe].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                  if ((0xe < local_78.m_rows) &&
                                                     (2 < local_78.m_cols)) {
                                                    local_78.m_data[local_78.m_cols * 0xe + 2] =
                                                         (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_cols;
                                                  (**(code **)(*(long *)&((this->nodes).
                                                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[0xf].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                  if ((0xf < local_78.m_rows) &&
                                                     (2 < local_78.m_cols)) {
                                                    local_78.m_data[local_78.m_cols * 0xf + 2] =
                                                         (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_cols;
                                                  (**(code **)(*(long *)&((this->nodes).
                                                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[0x10].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                  if ((0x10 < local_78.m_rows) &&
                                                     (2 < local_78.m_cols)) {
                                                    local_78.m_data[local_78.m_cols * 0x10 + 2] =
                                                         (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_cols;
                                                  (**(code **)(*(long *)&((this->nodes).
                                                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[0x11].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                  if ((0x11 < local_78.m_rows) &&
                                                     (2 < local_78.m_cols)) {
                                                    local_78.m_data[local_78.m_cols * 0x11 + 2] =
                                                         (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_cols;
                                                  (**(code **)(*(long *)&((this->nodes).
                                                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[0x12].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                  if ((0x12 < local_78.m_rows) &&
                                                     (2 < local_78.m_cols)) {
                                                    local_78.m_data[local_78.m_cols * 0x12 + 2] =
                                                         (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_cols;
                                                  (**(code **)(*(long *)&((this->nodes).
                                                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[0x13].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                  if ((0x13 < local_78.m_rows) &&
                                                     (2 < local_78.m_cols)) {
                                                    local_78.m_data[local_78.m_cols * 0x13 + 2] =
                                                         (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_cols;
                                                  if ((J1->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols == local_78.m_rows) {
                                                    local_38.m_lhs = J1;
                                                    local_38.m_rhs = (RhsNested)&local_78;
                                                    Eigen::Matrix<double,-1,-1,0,-1,-1>::
                                                                                                        
                                                  Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,_1,1,_1,_1>,0>>
                                                            ((Matrix<double,_1,_1,0,_1,_1> *)
                                                             &local_58,&local_38);
                                                  Eigen::internal::
                                                  call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
                                                            (Jacobian,&local_58,&local_39);
                                                  if (local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_data != (double *)0x0) {
                                                    free((void *)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_data[-1]);
                                                  }
                                                  if (local_78.m_data != (double *)0x0) {
                                                    free((void *)local_78.m_data[-1]);
                                                  }
                                                  return;
                                                  }
                                                  __assert_fail(
                                                  "lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                                                  ,"/usr/include/eigen3/Eigen/src/Core/Product.h",
                                                  0x62,
                                                  "Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Matrix<double, -1, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1, 1>, Rhs = Eigen::Matrix<double, -1, -1, 1>, Option = 0]"
                                                  );
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>, Level = 1]"
               );
}

Assistant:

void ChElementHexaCorot_20::ComputeJacobian(ChMatrixDynamic<>& Jacobian, ChMatrixDynamic<>& J1, ChVector<> coord) {
    ChMatrixDynamic<> J2(20, 3);

    J1(0, 0) = -(1 - coord.y()) * (1 - coord.z()) * (-1 - 2 * coord.x() - coord.y() - coord.z()) / 8;
    J1(0, 1) = +(1 - coord.y()) * (1 - coord.z()) * (-1 + 2 * coord.x() - coord.y() - coord.z()) / 8;
    J1(0, 2) = +(1 + coord.y()) * (1 - coord.z()) * (-1 + 2 * coord.x() + coord.y() - coord.z()) / 8;
    J1(0, 3) = -(1 + coord.y()) * (1 - coord.z()) * (-1 - 2 * coord.x() + coord.y() - coord.z()) / 8;
    J1(0, 4) = -(1 - coord.y()) * (1 + coord.z()) * (-1 - 2 * coord.x() - coord.y() + coord.z()) / 8;
    J1(0, 5) = +(1 - coord.y()) * (1 + coord.z()) * (-1 + 2 * coord.x() - coord.y() + coord.z()) / 8;
    J1(0, 6) = +(1 + coord.y()) * (1 + coord.z()) * (-1 + 2 * coord.x() + coord.y() + coord.z()) / 8;
    J1(0, 7) = -(1 + coord.y()) * (1 + coord.z()) * (-1 - 2 * coord.x() + coord.y() + coord.z()) / 8;
    J1(0, 8) = coord.x() * (1 - coord.y()) * (1 - coord.z()) / (-2);
    J1(0, 9) = +(1 - coord.y() * coord.y()) * (1 - coord.z()) / 4;
    J1(0, 10) = coord.x() * (1 + coord.y()) * (1 - coord.z()) / (-2);
    J1(0, 11) = -(1 - coord.y() * coord.y()) * (1 - coord.z()) / 4;
    J1(0, 12) = coord.x() * (1 - coord.y()) * (1 + coord.z()) / (-2);
    J1(0, 13) = +(1 - coord.y() * coord.y()) * (1 + coord.z()) / 4;
    J1(0, 14) = coord.x() * (1 + coord.y()) * (1 + coord.z()) / (-2);
    J1(0, 15) = -(1 - coord.y() * coord.y()) * (1 + coord.z()) / 4;
    J1(0, 16) = +(1 - coord.y()) * (1 - coord.z() * coord.z()) / 4;
    J1(0, 17) = +(1 + coord.y()) * (1 - coord.z() * coord.z()) / 4;
    J1(0, 18) = -(1 + coord.y()) * (1 - coord.z() * coord.z()) / 4;
    J1(0, 19) = -(1 - coord.y()) * (1 - coord.z() * coord.z()) / 4;

    J1(1, 0) = -(1 - coord.x()) * (1 - coord.z()) * (-1 - coord.x() - 2 * coord.y() - coord.z()) / 8;
    J1(1, 1) = -(1 + coord.x()) * (1 - coord.z()) * (-1 + coord.x() - 2 * coord.y() - coord.z()) / 8;
    J1(1, 2) = +(1 + coord.x()) * (1 - coord.z()) * (-1 + coord.x() + 2 * coord.y() - coord.z()) / 8;
    J1(1, 3) = +(1 - coord.x()) * (1 - coord.z()) * (-1 - coord.x() + 2 * coord.y() - coord.z()) / 8;
    J1(1, 4) = -(1 - coord.x()) * (1 + coord.z()) * (-1 - coord.x() - 2 * coord.y() + coord.z()) / 8;
    J1(1, 5) = -(1 + coord.x()) * (1 + coord.z()) * (-1 + coord.x() - 2 * coord.y() + coord.z()) / 8;
    J1(1, 6) = +(1 + coord.x()) * (1 + coord.z()) * (-1 + coord.x() + 2 * coord.y() + coord.z()) / 8;
    J1(1, 7) = +(1 - coord.x()) * (1 + coord.z()) * (-1 - coord.x() + 2 * coord.y() + coord.z()) / 8;
    J1(1, 8) = -(1 - coord.x() * coord.x()) * (1 - coord.z()) / 4;
    J1(1, 9) = coord.y() * (1 + coord.x()) * (1 - coord.z()) / (-2);
    J1(1, 10) = +(1 - coord.x() * coord.x()) * (1 - coord.z()) / 4;
    J1(1, 11) = coord.y() * (1 - coord.x()) * (1 - coord.z()) / (-2);
    J1(1, 12) = -(1 - coord.x() * coord.x()) * (1 + coord.z()) / 4;
    J1(1, 13) = coord.y() * (1 + coord.x()) * (1 + coord.z()) / (-2);
    J1(1, 14) = +(1 - coord.x() * coord.x()) * (1 + coord.z()) / 4;
    J1(1, 15) = coord.y() * (1 - coord.x()) * (1 + coord.z()) / (-2);
    J1(1, 16) = -(1 + coord.x()) * (1 - coord.z() * coord.z()) / 4;
    J1(1, 17) = +(1 + coord.x()) * (1 - coord.z() * coord.z()) / 4;
    J1(1, 18) = +(1 - coord.x()) * (1 - coord.z() * coord.z()) / 4;
    J1(1, 19) = -(1 - coord.x()) * (1 - coord.z() * coord.z()) / 4;

    J1(2, 0) = -(1 - coord.x()) * (1 - coord.y()) * (-1 - coord.x() - coord.y() - 2 * coord.z()) / 8;
    J1(2, 1) = -(1 + coord.x()) * (1 - coord.y()) * (-1 + coord.x() - coord.y() - 2 * coord.z()) / 8;
    J1(2, 2) = -(1 + coord.x()) * (1 + coord.y()) * (-1 + coord.x() + coord.y() - 2 * coord.z()) / 8;
    J1(2, 3) = -(1 - coord.x()) * (1 + coord.y()) * (-1 - coord.x() + coord.y() - 2 * coord.z()) / 8;
    J1(2, 4) = +(1 - coord.x()) * (1 - coord.y()) * (-1 - coord.x() - coord.y() + 2 * coord.z()) / 8;
    J1(2, 5) = +(1 + coord.x()) * (1 - coord.y()) * (-1 + coord.x() - coord.y() + 2 * coord.z()) / 8;
    J1(2, 6) = +(1 + coord.x()) * (1 + coord.y()) * (-1 + coord.x() + coord.y() + 2 * coord.z()) / 8;
    J1(2, 7) = +(1 - coord.x()) * (1 + coord.y()) * (-1 - coord.x() + coord.y() + 2 * coord.z()) / 8;
    J1(2, 8) = -(1 - coord.x() * coord.x()) * (1 - coord.y()) / 4;
    J1(2, 9) = -(1 + coord.x()) * (1 - coord.y() * coord.y()) / 4;
    J1(2, 10) = -(1 - coord.x() * coord.x()) * (1 + coord.y()) / 4;
    J1(2, 11) = -(1 - coord.x()) * (1 - coord.y() * coord.y()) / 4;
    J1(2, 12) = +(1 - coord.x() * coord.x()) * (1 - coord.y()) / 4;
    J1(2, 13) = +(1 + coord.x()) * (1 - coord.y() * coord.y()) / 4;
    J1(2, 14) = +(1 - coord.x() * coord.x()) * (1 + coord.y()) / 4;
    J1(2, 15) = +(1 - coord.x()) * (1 - coord.y() * coord.y()) / 4;
    J1(2, 16) = coord.z() * (1 + coord.x()) * (1 - coord.y()) / (-2);
    J1(2, 17) = coord.z() * (1 + coord.x()) * (1 + coord.y()) / (-2);
    J1(2, 18) = coord.z() * (1 - coord.x()) * (1 + coord.y()) / (-2);
    J1(2, 19) = coord.z() * (1 - coord.x()) * (1 - coord.y()) / (-2);

    J2(0, 0) = nodes[0]->GetX0().x();
    J2(1, 0) = nodes[1]->GetX0().x();
    J2(2, 0) = nodes[2]->GetX0().x();
    J2(3, 0) = nodes[3]->GetX0().x();
    J2(4, 0) = nodes[4]->GetX0().x();
    J2(5, 0) = nodes[5]->GetX0().x();
    J2(6, 0) = nodes[6]->GetX0().x();
    J2(7, 0) = nodes[7]->GetX0().x();
    J2(8, 0) = nodes[8]->GetX0().x();
    J2(9, 0) = nodes[9]->GetX0().x();
    J2(10, 0) = nodes[10]->GetX0().x();
    J2(11, 0) = nodes[11]->GetX0().x();
    J2(12, 0) = nodes[12]->GetX0().x();
    J2(13, 0) = nodes[13]->GetX0().x();
    J2(14, 0) = nodes[14]->GetX0().x();
    J2(15, 0) = nodes[15]->GetX0().x();
    J2(16, 0) = nodes[16]->GetX0().x();
    J2(17, 0) = nodes[17]->GetX0().x();
    J2(18, 0) = nodes[18]->GetX0().x();
    J2(19, 0) = nodes[19]->GetX0().x();

    J2(0, 1) = nodes[0]->GetX0().y();
    J2(1, 1) = nodes[1]->GetX0().y();
    J2(2, 1) = nodes[2]->GetX0().y();
    J2(3, 1) = nodes[3]->GetX0().y();
    J2(4, 1) = nodes[4]->GetX0().y();
    J2(5, 1) = nodes[5]->GetX0().y();
    J2(6, 1) = nodes[6]->GetX0().y();
    J2(7, 1) = nodes[7]->GetX0().y();
    J2(8, 1) = nodes[8]->GetX0().y();
    J2(9, 1) = nodes[9]->GetX0().y();
    J2(10, 1) = nodes[10]->GetX0().y();
    J2(11, 1) = nodes[11]->GetX0().y();
    J2(12, 1) = nodes[12]->GetX0().y();
    J2(13, 1) = nodes[13]->GetX0().y();
    J2(14, 1) = nodes[14]->GetX0().y();
    J2(15, 1) = nodes[15]->GetX0().y();
    J2(16, 1) = nodes[16]->GetX0().y();
    J2(17, 1) = nodes[17]->GetX0().y();
    J2(18, 1) = nodes[18]->GetX0().y();
    J2(19, 1) = nodes[19]->GetX0().y();

    J2(0, 2) = nodes[0]->GetX0().z();
    J2(1, 2) = nodes[1]->GetX0().z();
    J2(2, 2) = nodes[2]->GetX0().z();
    J2(3, 2) = nodes[3]->GetX0().z();
    J2(4, 2) = nodes[4]->GetX0().z();
    J2(5, 2) = nodes[5]->GetX0().z();
    J2(6, 2) = nodes[6]->GetX0().z();
    J2(7, 2) = nodes[7]->GetX0().z();
    J2(8, 2) = nodes[8]->GetX0().z();
    J2(9, 2) = nodes[9]->GetX0().z();
    J2(10, 2) = nodes[10]->GetX0().z();
    J2(11, 2) = nodes[11]->GetX0().z();
    J2(12, 2) = nodes[12]->GetX0().z();
    J2(13, 2) = nodes[13]->GetX0().z();
    J2(14, 2) = nodes[14]->GetX0().z();
    J2(15, 2) = nodes[15]->GetX0().z();
    J2(16, 2) = nodes[16]->GetX0().z();
    J2(17, 2) = nodes[17]->GetX0().z();
    J2(18, 2) = nodes[18]->GetX0().z();
    J2(19, 2) = nodes[19]->GetX0().z();

    Jacobian = J1 * J2;
}